

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByName(DescriptorPool *this,ConstStringParam name)

{
  Tables *this_00;
  StringPiece name_00;
  Symbol SVar1;
  
  this_00 = (this->tables_)._M_t.
            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
  name_00.ptr_ = (name->_M_dataplus)._M_p;
  name_00.length_ = name->_M_string_length;
  if ((long)name->_M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (name->_M_string_length,"string length exceeds max size");
  }
  SVar1 = Tables::FindByNameHelper(this_00,this,name_00);
  if ((SVar1.ptr_ == (SymbolBase *)0x0) || ((SVar1.ptr_)->symbol_type_ != '\x02')) {
    SVar1.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  }
  else if ((SVar1.ptr_[1].symbol_type_ & 8) == 0) {
    SVar1.ptr_ = (SymbolBase *)(FieldDescriptor *)0x0;
  }
  return (FieldDescriptor *)SVar1.ptr_;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByName(
    ConstStringParam name) const {
  if (const FieldDescriptor* field =
          tables_->FindByNameHelper(this, name).field_descriptor()) {
    if (field->is_extension()) {
      return field;
    }
  }
  return nullptr;
}